

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashInt.h
# Opt level: O2

int Hash_IntExists(Hash_Int_t *p,int key)

{
  Hash_Int_Entry_t *pHVar1;
  int iVar2;
  Hash_Int_Entry_t_ **ppHVar3;
  
  iVar2 = (*p->fHash)(key,p->nBins);
  ppHVar3 = p->pArray + iVar2;
  do {
    pHVar1 = *ppHVar3;
    if (pHVar1 == (Hash_Int_Entry_t *)0x0) {
      return 0;
    }
    ppHVar3 = &pHVar1->pNext;
  } while (pHVar1->key != key);
  return 1;
}

Assistant:

static inline int Hash_IntExists( Hash_Int_t *p, int key)
{
  int bin;
  Hash_Int_Entry_t *pEntry, **pLast;

  // find the bin where this key would live
  bin = (*(p->fHash))(key, p->nBins);

  // search for key
  pLast = &(p->pArray[bin]);
  pEntry = p->pArray[bin];
  while(pEntry) {
    if (pEntry->key == key) {
      return 1;
    }
    pLast = &(pEntry->pNext);
    pEntry = pEntry->pNext;
  }

  return 0;
}